

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_propertyf(nk_context *ctx,char *name,float min,float val,float max,float step,
                  float inc_per_pixel)

{
  nk_property_variant local_30;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5467,
                  "float nk_propertyf(struct nk_context *, const char *, float, float, float, float, float)"
                 );
  }
  if (name != (char *)0x0) {
    if (ctx->current != (nk_window *)0x0) {
      local_30.kind = NK_PROPERTY_FLOAT;
      local_30.value.f = val;
      local_30.min_value.f = min;
      local_30.max_value.f = max;
      local_30.step.f = step;
      nk_property(ctx,name,&local_30,inc_per_pixel,NK_FILTER_FLOAT);
      val = local_30.value.f;
    }
    return val;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x5468,
                "float nk_propertyf(struct nk_context *, const char *, float, float, float, float, float)"
               );
}

Assistant:

NK_API float
nk_propertyf(struct nk_context *ctx, const char *name, float min,
    float val, float max, float step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);

    if (!ctx || !ctx->current || !name) return val;
    variant = nk_property_variant_float(val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_FLOAT);
    val = variant.value.f;
    return val;
}